

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void TestEq<short,int>(short expval,int val,char *exp,char *file,int line)

{
  undefined6 in_register_0000003a;
  string expval_str;
  string val_str;
  
  if ((int)CONCAT62(in_register_0000003a,expval) == val) {
    return;
  }
  flatbuffers::NumToString<short>(&expval_str,expval);
  flatbuffers::NumToString<int>(&val_str,val);
  printf("TEST FAILED: %s:%d, %s (%s) != %s",file,line,exp,expval_str._M_dataplus._M_p,
         val_str._M_dataplus._M_p);
  putchar(10);
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/AlexStocks[P]flatbuffers/tests/test.cpp"
                ,0x2d,"void TestEq(T, U, const char *, const char *, int) [T = short, U = int]");
}

Assistant:

void TestEq(T expval, U val, const char *exp, const char *file, int line) {
  if (expval != val) {
    auto expval_str = flatbuffers::NumToString(expval);
    auto val_str = flatbuffers::NumToString(val);
    TEST_OUTPUT_LINE("TEST FAILED: %s:%d, %s (%s) != %s", file, line,
                     exp, expval_str.c_str(), val_str.c_str());
    assert(0);
    testing_fails++;
  }
}